

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O3

void bifcdr(bifcxdef *ctx,int argc)

{
  uint siz;
  ushort uVar1;
  runsdef *prVar2;
  runcxdef *prVar3;
  uint uVar4;
  uchar *puVar5;
  uint16_t tmp;
  uint uVar6;
  anon_union_8_4_1dda36f5_for_runsv aVar7;
  runsdef stkval;
  runsdef val;
  runsdef local_48;
  runsdef local_38;
  
  prVar2 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar2 + -1;
  prVar3 = ctx->bifcxrun;
  if (prVar2[-1].runstyp == '\a') {
    aVar7 = (anon_union_8_4_1dda36f5_for_runsv)(prVar3->runcxsp->runsv).runsvstr;
    local_48.runstyp = '\a';
    uVar1 = *(ushort *)aVar7.runsvstr;
    local_48.runsv = aVar7;
    if (uVar1 - 2 == 0) {
      runpush(prVar3,5,&local_38);
    }
    else {
      uVar4 = datsiz((uint)*(byte *)(aVar7.runsvnum + 2),(void *)(aVar7.runsvnum + 3));
      uVar6 = (uVar1 - 2) - (uVar4 + 1);
      siz = uVar6 + 2;
      prVar3 = ctx->bifcxrun;
      puVar5 = prVar3->runcxhp;
      if ((uint)(*(int *)&prVar3->runcxhtop - (int)puVar5) <= siz) {
        runhcmp(prVar3,siz,1,&local_48,(runsdef *)0x0,(runsdef *)0x0);
        puVar5 = ctx->bifcxrun->runcxhp;
        aVar7 = local_48.runsv;
      }
      *(short *)puVar5 = (short)siz;
      memcpy(ctx->bifcxrun->runcxhp + 2,aVar7.runsvstr + (ulong)(uVar4 + 1) + 2,(ulong)uVar6);
      local_38.runsv = (anon_union_8_4_1dda36f5_for_runsv)ctx->bifcxrun->runcxhp;
      local_38.runstyp = '\a';
      ctx->bifcxrun->runcxhp = local_38.runsv.runsvstr + siz;
      runrepush(ctx->bifcxrun,&local_38);
    }
    return;
  }
  prVar3->runcxerr->errcxptr->erraac = 0;
  runsign(ctx->bifcxrun,0x3fc);
}

Assistant:

void bifcdr(bifcxdef *ctx, int argc)
{
    uchar   *lstp;
    uint     siz;
    uint     lstsiz;
    runsdef  val;
    runsdef  stkval;
    
    bifcntargs(ctx, 1, argc);
    bifchkarg(ctx, DAT_LIST);
    
    lstp = runpoplst(ctx->bifcxrun);
    stkval.runstyp = DAT_LIST;
    stkval.runsv.runsvstr = lstp;
    
    /* get list's size, and point to its data string */
    lstsiz = osrp2(lstp) - 2;
    lstp += 2;
    
    if (lstsiz != 0)
    {
        /* deduct size of first element from size of list */
        siz = datsiz(*lstp, lstp+1) + 1;
        lstsiz -= siz;

        /* add in the size prefix for our new list size */
        lstsiz += 2;

        /* allocate space for new list containing rest of list */
        runhres1(ctx->bifcxrun, lstsiz, 1, &stkval);
        lstp = stkval.runsv.runsvstr + siz + 2;

        /* write out size followed by list value string */
        oswp2(ctx->bifcxrun->runcxhp, lstsiz);
        memcpy(ctx->bifcxrun->runcxhp+2, lstp, (size_t)(lstsiz-2));
        
        val.runsv.runsvstr = ctx->bifcxrun->runcxhp;
        val.runstyp = DAT_LIST;
        ctx->bifcxrun->runcxhp += lstsiz;
        runrepush(ctx->bifcxrun, &val);
    }
    else
        runpush(ctx->bifcxrun, DAT_NIL, &val);   /* empty list - cdr is nil */
}